

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O3

void do_alist(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  AREA_DATA_conflict *pAVar6;
  uint uVar7;
  char *__needle;
  char result [9216];
  char buf [4608];
  
  bVar2 = is_number(argument);
  if (bVar2) {
    iVar3 = atoi(argument);
    __needle = (char *)0x0;
  }
  else {
    iVar3 = 0;
    __needle = (char *)0x0;
    if (*argument != '\0') {
      __needle = argument;
    }
  }
  bVar2 = check_security(ch);
  if (bVar2) {
    sprintf(result,"[%3s] [%-27s] (%-5s-%5s) [%-10s] %3s [%-10s]\n\r","Num","Area Name","lvnum",
            "uvnum","Filename","Sec","Builders");
    if (__needle != (char *)0x0) {
      cVar1 = *__needle;
      pcVar4 = __needle;
      while (cVar1 != '\0') {
        cVar5 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar5 = cVar1;
        }
        *pcVar4 = cVar5;
        cVar1 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
      }
    }
    if (area_first != (AREA_DATA_conflict *)0x0) {
      pAVar6 = area_first;
      do {
        if (__needle == (char *)0x0) {
LAB_00355d44:
          if (iVar3 == 0) {
            uVar7 = (uint)pAVar6->max_vnum;
          }
          else if ((iVar3 < pAVar6->min_vnum) ||
                  (uVar7 = (uint)pAVar6->max_vnum, (int)uVar7 < iVar3)) goto LAB_00355d9d;
          sprintf(buf,"[%3d] %-29.29s (%-5d-%5d) %-12.12s [%d] [%-10.10s]\n\r",
                  (ulong)(uint)pAVar6->vnum,pAVar6->name,(ulong)(uint)(int)pAVar6->min_vnum,
                  (ulong)uVar7,pAVar6->file_name,(ulong)(uint)pAVar6->security,pAVar6->credits);
          strcat(result,buf);
        }
        else {
          pcVar4 = lowstring(pAVar6->name);
          pcVar4 = strstr(pcVar4,__needle);
          if (pcVar4 != (char *)0x0) goto LAB_00355d44;
        }
LAB_00355d9d:
        pAVar6 = pAVar6->next;
      } while (pAVar6 != (AREA_DATA_conflict *)0x0);
    }
    send_to_char(result,ch);
  }
  return;
}

Assistant:

void do_alist(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char result[MAX_STRING_LENGTH * 2]; /* May need tweaking. */
	AREA_DATA *pArea;
	int vmatch = 0;
	char *nmatch = nullptr, *amatch = nullptr;

	if (is_number(argument))
		vmatch = atoi(argument);
	else if (argument[0] != '\0')
		nmatch = argument;

	if (!check_security(ch))
		return;

	sprintf(result, "[%3s] [%-27s] (%-5s-%5s) [%-10s] %3s [%-10s]\n\r", "Num", "Area Name", "lvnum", "uvnum", "Filename", "Sec", "Builders");

	if (nmatch)
	{
		for (amatch = nmatch; *amatch; amatch++)
		{
			*amatch = LOWER(*amatch);
		}
	}

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		if (nmatch != nullptr && !strstr(lowstring(pArea->name), nmatch))
			continue;
		else if (vmatch && (pArea->min_vnum > vmatch || pArea->max_vnum < vmatch))
			continue;

		sprintf(buf, "[%3d] %-29.29s (%-5d-%5d) %-12.12s [%d] [%-10.10s]\n\r",
			pArea->vnum,
			pArea->name,
			pArea->min_vnum,
			pArea->max_vnum,
			pArea->file_name,
			pArea->security,
			pArea->credits);

		strcat(result, buf);
	}

	send_to_char(result, ch);
}